

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test::TestBody
          (ArenaTest_SwapBetweenArenaAndNonArenaUsingReflection_Test *this)

{
  TestAllTypes *message;
  Metadata MVar1;
  Arena arena2;
  TestAllTypes non_arena_message;
  ThreadSafeArena local_3f0;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_348);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_3f0);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  MVar1 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  Reflection::Swap(MVar1.reflection,&local_348.super_Message,(Message *)message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_348);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_3f0);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenaAndNonArenaUsingReflection) {
  TestAllTypes non_arena_message;
  TestUtil::SetAllFields(&non_arena_message);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    const Reflection* r = arena2_message->GetReflection();
    r->Swap(&non_arena_message, arena2_message);
    TestUtil::ExpectAllFieldsSet(*arena2_message);
    TestUtil::ExpectAllFieldsSet(non_arena_message);
  }
}